

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O1

bool xercesc_4_0::XMLUri::isURIString(XMLCh *uricString)

{
  short *psVar1;
  XMLCh *pXVar2;
  XMLCh theChar;
  bool bVar3;
  int iVar4;
  long lVar5;
  
  if (uricString == (XMLCh *)0x0) {
    return false;
  }
  if (*uricString == L'\0') {
LAB_0025c6d3:
    bVar3 = false;
  }
  else {
    theChar = *uricString;
    while (bVar3 = theChar == L'\0', !bVar3) {
      bVar3 = XMLString::isAlphaNum(theChar);
      lVar5 = 2;
      if ((!bVar3) &&
         (iVar4 = XMLString::indexOf((XMLCh *)MARK_OR_RESERVED_CHARACTERS,theChar), iVar4 == -1)) {
        if (*uricString != L'%') goto LAB_0025c6d3;
        lVar5 = 0;
        do {
          psVar1 = (short *)((long)uricString + lVar5);
          lVar5 = lVar5 + 2;
        } while (*psVar1 != 0);
        if ((0xfffffffffffffffc < (lVar5 >> 1) - 4U) ||
           (bVar3 = XMLString::isHex(uricString[1]), !bVar3)) goto LAB_0025c6d3;
        bVar3 = XMLString::isHex(uricString[2]);
        lVar5 = 6;
        if (!bVar3) goto LAB_0025c6d3;
      }
      pXVar2 = (XMLCh *)((long)uricString + lVar5);
      uricString = (XMLCh *)((long)uricString + lVar5);
      theChar = *pXVar2;
    }
  }
  return bVar3;
}

Assistant:

bool XMLUri::isURIString(const XMLCh* const uricString)
{
	if (!uricString || !*uricString)
        return false;

    const XMLCh* tmpStr = uricString;

    while (*tmpStr)
    {
        if (isReservedOrUnreservedCharacter(*tmpStr))
        {
            tmpStr++;
        }
        else if (*tmpStr == chPercent)               // '%'
        {
            if (XMLString::stringLen(tmpStr) >=3
                && XMLString::isHex(*(tmpStr+1))     // 1st hex
                && XMLString::isHex(*(tmpStr+2))  )  // 2nd hex
            {
                tmpStr+=3;
            }
            else
            {
                return false;
            }
        }
        else
        {
            return false;
        }
    }

    return true;
}